

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O2

void __thiscall
solitaire::piles::FoundationPileWithAceTest::FoundationPileWithAceTest
          (FoundationPileWithAceTest *this)

{
  initializer_list<solitaire::cards::Card> __l;
  allocator_type local_29;
  optional<solitaire::cards::Card> cardToAdd;
  
  EmptyFoundationPileTest::EmptyFoundationPileTest(&this->super_EmptyFoundationPileTest);
  (this->super_EmptyFoundationPileTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileWithAceTest_002fc1a8;
  solitaire::cards::Card::Card((Card *)&cardToAdd,Ace,Heart);
  __l._M_len = 1;
  __l._M_array = (iterator)&cardToAdd;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->pileCards,__l,&local_29);
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload =
       *(_Storage<solitaire::cards::Card,_true> *)
        (this->pileCards).
        super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
        super__Vector_impl_data._M_start;
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_engaged = true;
  (*(((this->super_EmptyFoundationPileTest).pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[4])();
  return;
}

Assistant:

FoundationPileWithAceTest() {
        std::optional<Card> cardToAdd = pileCards.front();
        pile->tryAddCard(cardToAdd);
    }